

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O1

void __thiscall
hgdb::json::Scope<hgdb::json::Module>::serialize(Scope<hgdb::json::Module> *this,JSONWriter *w)

{
  pointer pcVar1;
  pointer puVar2;
  ScopeBase *pSVar3;
  int iVar4;
  JSONWriter *pJVar5;
  undefined4 extraout_var;
  char *extraout_RDX;
  unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_> *scope;
  pointer puVar6;
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> value;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  char local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_69 = '{';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w->field_0x10,&local_69,1);
  name._M_str = "type";
  name._M_len = 4;
  pJVar5 = JSONWriter::key(w,name);
  iVar4 = (*(this->super_ScopeBase)._vptr_ScopeBase[3])(this);
  value._M_len._4_4_ = extraout_var;
  value._M_len._0_4_ = iVar4;
  value._M_str = extraout_RDX;
  JSONWriter::value<std::basic_string_view<char,std::char_traits<char>>>(pJVar5,value);
  if ((this->filename)._M_string_length != 0) {
    name_00._M_str = "filename";
    name_00._M_len = 8;
    pJVar5 = JSONWriter::key(w,name_00);
    pcVar1 = (this->filename)._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + (this->filename)._M_string_length);
    JSONWriter::value<std::__cxx11::string>(pJVar5,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->line_num).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    name_01._M_str = "line";
    name_01._M_len = 4;
    pJVar5 = JSONWriter::key(w,name_01);
    std::ostream::_M_insert<unsigned_long>((ulong)&pJVar5->field_0x10);
    local_69 = ',';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pJVar5->field_0x10,&local_69,1);
    if (this->column_num != 0) {
      name_02._M_str = "column";
      name_02._M_len = 6;
      pJVar5 = JSONWriter::key(w,name_02);
      std::ostream::_M_insert<unsigned_long>((ulong)&pJVar5->field_0x10);
      local_69 = ',';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pJVar5->field_0x10,&local_69,1)
      ;
    }
  }
  if ((this->condition)._M_string_length != 0) {
    name_03._M_str = "condition";
    name_03._M_len = 9;
    pJVar5 = JSONWriter::key(w,name_03);
    pcVar1 = (this->condition)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + (this->condition)._M_string_length);
    JSONWriter::value<std::__cxx11::string>(pJVar5,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  name_04._M_str = "scope";
  name_04._M_len = 5;
  pJVar5 = JSONWriter::key(w,name_04);
  local_69 = '[';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pJVar5->field_0x10,&local_69,1);
  puVar2 = (this->super_ScopeBase).scopes_.
           super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->super_ScopeBase).scopes_.
                super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1) {
    pSVar3 = (puVar6->_M_t).
             super___uniq_ptr_impl<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_hgdb::json::ScopeBase_*,_std::default_delete<hgdb::json::ScopeBase>_>
             .super__Head_base<0UL,_hgdb::json::ScopeBase_*,_false>._M_head_impl;
    (**pSVar3->_vptr_ScopeBase)(pSVar3,w);
  }
  JSONWriter::end_array(w);
  (*(this->super_ScopeBase)._vptr_ScopeBase[5])(this,w);
  JSONWriter::end_obj(w);
  return;
}

Assistant:

void serialize(JSONWriter &w) const override {
        w.begin_obj().key("type").value(type());
        if (!filename.empty()) {
            w.key("filename").value(filename);
        }
        if (line_num) {
            w.key("line").value(*line_num);
            if (column_num != 0) {
                w.key("column").value(column_num);
            }
        }
        if (!condition.empty()) {
            w.key("condition").value(condition);
        }

        bool has_scope = !scopes_.empty();
        if constexpr (std::is_same_v<C, Module>) {
            has_scope = true;
        }

        if (has_scope) {
            w.key("scope").begin_array();
            for (auto const &scope : scopes_) {
                scope->serialize(w);
            }
            w.end_array();
        }

        serialize_(w);

        w.end_obj();
    }